

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

size_t __thiscall Board::hash(Board *this)

{
  char tile;
  char *__end2;
  char *__begin2;
  Row *__range2;
  Row *row;
  char (*__end1) [3];
  char (*__begin1) [3];
  char (*__range1) [3] [3];
  size_t key;
  Board *this_local;
  
  __range1 = (char (*) [3] [3])0x0;
  for (__end1 = (char (*) [3])this; __end1 != (char (*) [3])&this->field_0x9; __end1 = __end1 + 1) {
    for (__end2 = *__end1; (char (*) [3])__end2 != __end1 + 1; __end2 = __end2 + 1) {
      __range1 = (char (*) [3] [3])((long)__range1 * 10 + (long)(*__end2 + -0x30));
    }
  }
  return (size_t)__range1;
}

Assistant:

size_t Board::hash() const {
    size_t key = 0;

    for (const Board::Row& row : board) {
        for (char tile : row) {
            key = key * 10 + (tile - '0');
        }
    }

    return key;
}